

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

double __thiscall wasm::Literal::copysign(Literal *this,double __x,double __y)

{
  BasicType BVar1;
  ulong *in_RDX;
  ulong *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  Literal local_60;
  Literal local_38;
  ulong *local_20;
  Literal *other_local;
  Literal *this_local;
  
  local_20 = in_RDX;
  this_local = this;
  BVar1 = wasm::Type::getBasic((Type *)(in_RSI + 2));
  if (BVar1 == f32) {
    Literal(&local_38,(uint)*in_RSI & 0x7fffffff | (uint)*local_20 & 0x80000000);
    castToF32(this,&local_38);
    ~Literal(&local_38);
    dVar2 = extraout_XMM0_Qa;
  }
  else {
    if (BVar1 != f64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x627);
    }
    Literal(&local_60,*in_RSI & 0x7fffffffffffffff | *local_20 & 0x8000000000000000);
    castToF64(this,&local_60);
    ~Literal(&local_60);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

Literal Literal::copysign(const Literal& other) const {
  // operate on bits directly, to avoid signalling bit being set on a float
  switch (type.getBasic()) {
    case Type::f32:
      return Literal((i32 & 0x7fffffff) | (other.i32 & 0x80000000)).castToF32();
      break;
    case Type::f64:
      return Literal((i64 & 0x7fffffffffffffffUL) |
                     (other.i64 & 0x8000000000000000UL))
        .castToF64();
      break;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}